

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_0,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  long k_1;
  double *b0_1;
  long j2_1;
  long k;
  double *b3;
  double *b2;
  double *b1;
  double *b0;
  long j2;
  long count;
  long packet_cols;
  conj_if<false> cj;
  long local_90;
  long local_80;
  long local_78;
  long local_50;
  long local_48;
  conj_if<false> local_31;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ignore_unused_variable<long>(&k_1);
  ignore_unused_variable<long>((long *)&b0_1);
  if (k_1 < local_28 || k_1 < (long)b0_1) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x4c6,
                  "void Eigen::internal::gemm_pack_rhs<double, long, 4, 0, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
                 );
  }
  local_80 = local_30 / 4 << 2;
  local_48 = 0;
  for (local_50 = 0; local_50 < local_80; local_50 = local_50 + 4) {
    local_48 = (long)b0_1 * 4 + local_48;
    lVar1 = local_18 + local_50 * local_20 * 8;
    lVar2 = local_18 + (local_50 + 1) * local_20 * 8;
    lVar3 = local_18 + (local_50 + 2) * local_20 * 8;
    lVar4 = local_18 + (local_50 + 3) * local_20 * 8;
    for (local_78 = 0; local_78 < local_28; local_78 = local_78 + 1) {
      pdVar5 = conj_if<false>::operator()(&local_31,(double *)(lVar1 + local_78 * 8));
      *(double *)(local_10 + local_48 * 8) = *pdVar5;
      pdVar5 = conj_if<false>::operator()(&local_31,(double *)(lVar2 + local_78 * 8));
      *(double *)(local_10 + 8 + local_48 * 8) = *pdVar5;
      pdVar5 = conj_if<false>::operator()(&local_31,(double *)(lVar3 + local_78 * 8));
      *(double *)(local_10 + 0x10 + local_48 * 8) = *pdVar5;
      pdVar5 = conj_if<false>::operator()(&local_31,(double *)(lVar4 + local_78 * 8));
      *(double *)(local_10 + 0x18 + local_48 * 8) = *pdVar5;
      local_48 = local_48 + 4;
    }
    local_48 = ((k_1 - (long)b0_1) - local_28) * 4 + local_48;
  }
  for (; local_80 < local_30; local_80 = local_80 + 1) {
    local_48 = (long)b0_1 + local_48;
    lVar1 = local_18 + local_80 * local_20 * 8;
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      pdVar5 = conj_if<false>::operator()(&local_31,(double *)(lVar1 + local_90 * 8));
      *(double *)(local_10 + local_48 * 8) = *pdVar5;
      local_48 = local_48 + 1;
    }
    local_48 = ((k_1 - (long)b0_1) - local_28) + local_48;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    const Scalar* b1 = &rhs[(j2+1)*rhsStride];
    const Scalar* b2 = &rhs[(j2+2)*rhsStride];
    const Scalar* b3 = &rhs[(j2+3)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
                blockB[count+0] = cj(b0[k]);
                blockB[count+1] = cj(b1[k]);
      if(nr==4) blockB[count+2] = cj(b2[k]);
      if(nr==4) blockB[count+3] = cj(b3[k]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k]);
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}